

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall
helics::FederateState::generateProfilingMessage(FederateState *this,bool enterHelicsCode)

{
  format_args args;
  string_view fmt;
  GlobalFederateId GVar1;
  ActionMessage *this_00;
  byte in_SIL;
  value<fmt::v11::context> *in_RDI;
  ActionMessage prof;
  string message;
  time_point ctime;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  string_view *this_01;
  BrokerBase *x;
  action_t startingAction;
  GlobalFederateId in_stack_fffffffffffffd80;
  GlobalFederateId sourceId;
  GlobalFederateId in_stack_fffffffffffffd88;
  FederateStates in_stack_fffffffffffffdaf;
  double local_188;
  rep local_180;
  duration<long,_std::ratio<1L,_1000000000L>_> local_178;
  rep local_170;
  GlobalFederateId local_168;
  BaseType local_164;
  char *local_160;
  undefined8 local_158;
  undefined1 local_150 [32];
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_130;
  byte local_121;
  undefined1 local_118 [16];
  BaseType local_108 [2];
  undefined1 in_stack_ffffffffffffff03;
  int in_stack_ffffffffffffff04;
  FederateState *in_stack_ffffffffffffff08;
  string_view in_stack_ffffffffffffff10;
  string_view in_stack_ffffffffffffff20;
  char *pcVar2;
  double local_c8 [2];
  undefined8 local_b8;
  undefined1 *local_b0;
  char *local_a8;
  undefined8 local_a0;
  double *local_98;
  rep *local_90;
  BrokerBase *local_88;
  ActionMessage *local_80;
  BaseType *local_78;
  char *local_68;
  undefined8 local_60;
  undefined1 *local_58;
  BaseType local_4c;
  BaseType *local_48;
  
  local_121 = in_SIL & 1;
  local_130.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_160 = "<PROFILING>{}[{}]({})HELICS CODE {}<{}>[t={}]</PROFILING>";
  local_158 = 0x39;
  local_168 = std::atomic<helics::GlobalFederateId>::load
                        ((atomic<helics::GlobalFederateId> *)((long)&in_RDI[2].field_0 + 0xc),
                         seq_cst);
  local_164 = GlobalFederateId::baseValue(&local_168);
  getState((FederateState *)0x4c5388);
  this_00 = (ActionMessage *)fedStateString_abi_cxx11_(in_stack_fffffffffffffdaf);
  if ((local_121 & 1) == 0) {
    this_01 = &generateProfilingMessage::exit_string;
  }
  else {
    this_01 = &generateProfilingMessage::entry_string;
  }
  x = (BrokerBase *)this_01;
  local_180 = (rep)std::chrono::
                   time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   ::time_since_epoch(&local_130);
  local_178.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                       CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  local_170 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_178);
  local_188 = TimeRepresentation::operator_cast_to_double
                        ((TimeRepresentation<count_time<9,_long>_> *)0x4c5415);
  local_58 = local_150;
  local_68 = local_160;
  local_60 = local_158;
  local_78 = &local_164;
  local_90 = &local_170;
  local_98 = &local_188;
  local_a8 = local_160;
  local_a0 = local_158;
  local_88 = (BrokerBase *)this_01;
  local_80 = this_00;
  ::fmt::v11::detail::value<fmt::v11::context>::
  value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
            (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)x);
  local_48 = local_108;
  local_4c = *local_78;
  local_108[0] = local_4c;
  ::fmt::v11::detail::value<fmt::v11::context>::
  value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
            (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)x);
  ::fmt::v11::detail::value<fmt::v11::context>::
  value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
            (in_RDI,(basic_string_view<char,_std::char_traits<char>_> *)x);
  pcVar2 = (char *)*local_90;
  local_c8[0] = *local_98;
  local_b0 = local_118;
  local_b8 = 0xa3dd1d;
  fmt.size_ = (size_t)&stack0xffffffffffffff28;
  fmt.data_ = (char *)*local_90;
  args.field_1.values_ = (value<fmt::v11::context> *)local_c8;
  args.desc_ = (unsigned_long_long)local_c8[0];
  ::fmt::v11::vformat_abi_cxx11_(fmt,args);
  if ((undefined1  [16])
      ((undefined1  [16])in_RDI[0x29].field_0.uint128_value & (undefined1  [16])0x100000000000000)
      == (undefined1  [16])0x0) {
    if (in_RDI[0x2a].field_0.string.size != 0) {
      GVar1 = std::atomic<helics::GlobalFederateId>::load
                        ((atomic<helics::GlobalFederateId> *)((long)&in_RDI[2].field_0 + 0xc),
                         seq_cst);
      startingAction = (action_t)((ulong)in_RDI >> 0x20);
      sourceId.gid = 0;
      GlobalFederateId::GlobalFederateId
                ((GlobalFederateId *)&stack0xfffffffffffffd88,(GlobalBrokerId)0x0);
      ActionMessage::ActionMessage(this_00,startingAction,sourceId,in_stack_fffffffffffffd80);
      SmallBuffer::operator=
                ((SmallBuffer *)CONCAT44(GVar1.gid,in_stack_fffffffffffffd88.gid),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(sourceId.gid,in_stack_fffffffffffffd80.gid));
      BrokerBase::addActionMessage
                ((BrokerBase *)this_01,
                 (ActionMessage *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      ActionMessage::~ActionMessage((ActionMessage *)this_01);
    }
  }
  else {
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
    logMessage(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_ffffffffffffff20,
               in_stack_ffffffffffffff10,(bool)in_stack_ffffffffffffff03);
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  return;
}

Assistant:

void FederateState::generateProfilingMessage(bool enterHelicsCode)
{
    auto ctime = std::chrono::steady_clock::now();
    static constexpr std::string_view entry_string("ENTRY");
    static constexpr std::string_view exit_string("EXIT");
    const std::string message = fmt::format(
        "<PROFILING>{}[{}]({})HELICS CODE {}<{}>[t={}]</PROFILING>",
        name,
        global_id.load().baseValue(),
        fedStateString(getState()),
        (enterHelicsCode ? entry_string : exit_string),
        std::chrono::duration_cast<std::chrono::nanoseconds>(ctime.time_since_epoch()).count(),
        static_cast<double>(time_granted));
    if (mLocalProfileCapture) {
        logMessage(HELICS_LOG_LEVEL_PROFILING, name, message);
    } else {
        if (mParent != nullptr) {
            ActionMessage prof(CMD_PROFILER_DATA, global_id.load(), parent_broker_id);
            prof.payload = message;
            mParent->addActionMessage(std::move(prof));
        }
    }
}